

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char **ppcVar1;
  int i;
  long lVar2;
  
  ppcVar1 = &tests[0].name;
  for (lVar2 = 0; lVar2 < ntests; lVar2 = lVar2 + 1) {
    puts(*ppcVar1);
    (*((Test *)(ppcVar1 + -1))->fn)();
    ppcVar1 = ppcVar1 + 2;
  }
  puts("PASS");
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  for (int i = 0; i < ntests; i++) {
    printf("%s\n", tests[i].name);
    tests[i].fn();
  }
  printf("PASS\n");
  return 0;
}